

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::BlindTxInRequest::BlindTxInRequest
          (BlindTxInRequest *this,BlindTxInRequest *param_1)

{
  (this->super_JsonClassBase<cfd::js::api::json::BlindTxInRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__BlindTxInRequest_00b42658;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  std::__cxx11::string::string((string *)&this->txid_,(string *)&param_1->txid_);
  this->vout_ = param_1->vout_;
  std::__cxx11::string::string((string *)&this->asset_,(string *)&param_1->asset_);
  std::__cxx11::string::string((string *)&this->blind_factor_,(string *)&param_1->blind_factor_);
  std::__cxx11::string::string
            ((string *)&this->asset_blind_factor_,(string *)&param_1->asset_blind_factor_);
  this->amount_ = param_1->amount_;
  return;
}

Assistant:

BlindTxInRequest() {
    CollectFieldName();
  }